

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
BinaryExpr<const_std::__detail::_Node_iterator<std::pair<const_acto::actor_ref,_int>,_false,_false>_&,_const_std::__detail::_Node_iterator<std::pair<const_acto::actor_ref,_int>,_false,_false>_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::__detail::_Node_iterator<std::pair<const_acto::actor_ref,_int>,_false,_false>_&,_const_std::__detail::_Node_iterator<std::pair<const_acto::actor_ref,_int>,_false,_false>_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string
            (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  std::__cxx11::string::string
            (local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_40,lhs,op,in_R9);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }